

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall ON_BoundingBox::Union(ON_BoundingBox *this,ON_BoundingBox *a)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  bVar2 = IsNotEmpty(this);
  bVar3 = IsNotEmpty(a);
  if (bVar2) {
    if (bVar3) {
      dVar4 = (a->m_min).x;
      if (dVar4 < (this->m_min).x) {
        (this->m_min).x = dVar4;
      }
      dVar4 = (a->m_min).y;
      if (dVar4 < (this->m_min).y) {
        (this->m_min).y = dVar4;
      }
      dVar4 = (a->m_min).z;
      if (dVar4 < (this->m_min).z) {
        (this->m_min).z = dVar4;
      }
      dVar4 = (a->m_max).x;
      if ((this->m_max).x <= dVar4 && dVar4 != (this->m_max).x) {
        (this->m_max).x = dVar4;
      }
      dVar4 = (a->m_max).y;
      pdVar1 = &(this->m_max).y;
      if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
        (this->m_max).y = dVar4;
      }
      dVar4 = (a->m_max).z;
      pdVar1 = &(this->m_max).z;
      if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
        (this->m_max).z = dVar4;
      }
    }
  }
  else {
    dVar4 = EmptyBoundingBox.m_min.x;
    dVar5 = EmptyBoundingBox.m_min.y;
    dVar6 = EmptyBoundingBox.m_min.z;
    dVar7 = EmptyBoundingBox.m_max.x;
    uVar8 = EmptyBoundingBox.m_max.y._0_4_;
    uVar9 = EmptyBoundingBox.m_max.y._4_4_;
    uVar10 = EmptyBoundingBox.m_max.z._0_4_;
    uVar11 = EmptyBoundingBox.m_max.z._4_4_;
    if (bVar3) {
      dVar4 = (a->m_min).x;
      dVar5 = (a->m_min).y;
      dVar6 = (a->m_min).z;
      dVar7 = (a->m_max).x;
      uVar8 = *(undefined4 *)&(a->m_max).y;
      uVar9 = *(undefined4 *)((long)&(a->m_max).y + 4);
      uVar10 = *(undefined4 *)&(a->m_max).z;
      uVar11 = *(undefined4 *)((long)&(a->m_max).z + 4);
    }
    *(undefined4 *)&(this->m_max).y = uVar8;
    *(undefined4 *)((long)&(this->m_max).y + 4) = uVar9;
    *(undefined4 *)&(this->m_max).z = uVar10;
    *(undefined4 *)((long)&(this->m_max).z + 4) = uVar11;
    (this->m_min).z = dVar6;
    (this->m_max).x = dVar7;
    (this->m_min).x = dVar4;
    (this->m_min).y = dVar5;
  }
  bVar2 = IsNotEmpty(this);
  return bVar2;
}

Assistant:

bool ON_BoundingBox::Union(
          const ON_BoundingBox& a
          )
{
  if ( IsValid() ) {
    if ( a.IsValid() ) {
      if ( a.m_min.x < m_min.x )
        m_min.x = a.m_min.x;
      if ( a.m_min.y < m_min.y )
        m_min.y = a.m_min.y;
      if ( a.m_min.z < m_min.z )
        m_min.z = a.m_min.z;
      if ( a.m_max.x > m_max.x )
        m_max.x = a.m_max.x;
      if ( a.m_max.y > m_max.y )
        m_max.y = a.m_max.y;
      if ( a.m_max.z > m_max.z )
        m_max.z = a.m_max.z;
    }
  }
  else if ( a.IsValid() ) {
    *this = a;
  }
  else {
    Destroy();
  }
  return IsValid();
}